

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketcan-cyclic-demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __sighandler_t p_Var3;
  ushort *puVar4;
  ssize_t sVar5;
  int *piVar6;
  long lVar7;
  char *pcVar8;
  ifreq ifr;
  sockaddr_can addr;
  can_msg msg;
  char local_d0 [16];
  char local_c0 [24];
  sockaddr local_a8;
  undefined4 local_90;
  undefined8 local_8c;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint local_58;
  undefined1 local_54 [4];
  ushort local_50;
  undefined1 local_4e [54];
  
  if (argc < 2) {
    main_cold_2();
  }
  else {
    iVar1 = getopt(argc,argv,"hv");
    if (iVar1 != -1) {
      if (iVar1 == 0x76) {
        pcVar8 = "socketcan-bcm-demo 1.0.0\n";
      }
      else {
        pcVar8 = 
        "Usage: socketcan-bcm-demo[OPTIONS] IFACE\nWhere:\n  IFACE    CAN network interface\nOptions:\n  -h       Display this help then exit\n  -v       Display version info then exit\n"
        ;
        if (iVar1 != 0x68) {
          puts(
              "Usage: socketcan-bcm-demo[OPTIONS] IFACE\nWhere:\n  IFACE    CAN network interface\nOptions:\n  -h       Display this help then exit\n  -v       Display version info then exit\n"
              );
          return 1;
        }
      }
      puts(pcVar8);
      return 0;
    }
    if (_optind == argc - 1U) {
      pcVar8 = argv[_optind];
      p_Var3 = signal(2,onsig);
      if (((p_Var3 == (__sighandler_t)0xffffffffffffffff) ||
          (p_Var3 = signal(0xf,onsig), p_Var3 == (__sighandler_t)0xffffffffffffffff)) ||
         (p_Var3 = signal(0x11,(__sighandler_t)0x1), p_Var3 == (__sighandler_t)0xffffffffffffffff))
      {
        pcVar8 = "socketcan-bcm-demo";
      }
      else {
        iVar1 = socket(0x1d,2,2);
        if (iVar1 < 0) {
          pcVar8 = "socketcan-bcm-demo: socket";
        }
        else {
          strncpy(local_d0,pcVar8,0x10);
          iVar2 = ioctl(iVar1,0x8933,local_d0);
          if (iVar2 < 0) {
            pcVar8 = "socketcan-bcm-demo: ioctl";
          }
          else {
            local_a8.sa_family = 0x1d;
            local_a8.sa_data[2] = local_c0[0];
            local_a8.sa_data[3] = local_c0[1];
            local_a8.sa_data[4] = local_c0[2];
            local_a8.sa_data[5] = local_c0[3];
            iVar2 = connect(iVar1,&local_a8,0x18);
            if (iVar2 < 0) {
              pcVar8 = "socketcan-bcm-demo: connect";
            }
            else {
              sigval = 0;
              puVar4 = &local_50;
              local_90 = 1;
              local_60 = 0x400000000;
              local_8c = 3;
              local_70 = 1;
              local_68 = 200000;
              lVar7 = 0;
              do {
                *(uint *)(puVar4 + -4) = (uint)lVar7 | 0xc0;
                *(undefined1 *)(puVar4 + -2) = 3;
                *(char *)(puVar4 + 1) = (char)lVar7;
                *puVar4 = (ushort)lVar7 & 0xff | (ushort)((uint)lVar7 << 8);
                lVar7 = lVar7 + 1;
                puVar4 = puVar4 + 8;
              } while (lVar7 != 4);
              sVar5 = write(iVar1,&local_90,0x78);
              if (sVar5 < 0) {
                pcVar8 = "socketcan-bcm-demo: write: TX_SETUP";
              }
              else {
                printf("Cyclic messages registed with SocketCAN!\nUse a tool such as \"candump %s\" to view the messages.\nThese messages will continue to transmit so long as the socket\nused to communicate with SocketCAN remains open. In other words,\nclose this program with SIGINT or SIGTERM in order to gracefully\nstop transmitting.\n"
                       ,pcVar8);
                while (sigval == 0) {
                  usleep(10000);
                }
                puts("\nGoodbye!");
                iVar1 = close(iVar1);
                if (-1 < iVar1) {
                  return 0;
                }
                pcVar8 = "socketcan-bcm-demo: close";
              }
            }
          }
        }
      }
      perror(pcVar8);
      piVar6 = __errno_location();
      return *piVar6;
    }
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned int i;
    int opt;
    int s;
    char *iface;
    struct sockaddr_can addr;
    struct ifreq ifr;
    
    struct can_msg
    {
        struct bcm_msg_head msg_head;
        struct can_frame frame[NFRAMES];
    } msg;

    /* Check if at least one argument was specified */
    if (argc < 2)
    {
        fputs("Too few arguments!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Parse command line options */
    while ((opt = getopt(argc, argv, "hv")) != -1)
    {
        switch (opt)
        {
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'v':
            version();
            return EXIT_SUCCESS;
        default:
            usage();
            return EXIT_FAILURE;
        }
    }

    /* Exactly one command line argument must remain; the interface to use */
    if (optind == (argc - 1))
    {
        iface = argv[optind];
    }
    else
    {
        fputs("Only one interface may be used!\n", stderr);
        usage();
        return EXIT_FAILURE;
    }

    /* Register signal handlers */
    if (signal(SIGINT, onsig)    == SIG_ERR ||
        signal(SIGTERM, onsig)   == SIG_ERR ||
        signal(SIGCHLD, SIG_IGN) == SIG_ERR)
    {
        perror(PROGNAME);
        return errno;
    }

    /* Open the CAN interface */
    s = socket(PF_CAN, SOCK_DGRAM, CAN_BCM);
    if (s < 0)
    {
        perror(PROGNAME ": socket");
        return errno;
    }

    strncpy(ifr.ifr_name, iface, IFNAMSIZ);
    if (ioctl(s, SIOCGIFINDEX, &ifr) < 0)
    {
        perror(PROGNAME ": ioctl");
        return errno;
    }

    addr.can_family = AF_CAN;
    addr.can_ifindex = ifr.ifr_ifindex;
    if (connect(s, (struct sockaddr *)&addr, sizeof(addr)) < 0)
    {
        perror(PROGNAME ": connect");
        return errno;
    }

    /* Setup code */
    sigval = 0;

    /* Set up cyclic messages. Note that both SETTIMER and STARTTIMER are
     * required as flags in order to continue transmitting.
     */
    msg.msg_head.opcode  = TX_SETUP;
    msg.msg_head.can_id  = 0;
    msg.msg_head.flags   = SETTIMER | STARTTIMER;
    msg.msg_head.nframes = NFRAMES;
    msg.msg_head.count   = 0;

    /* Set the time interval value to 1200 ms */
    msg.msg_head.ival2.tv_sec = 1;
    msg.msg_head.ival2.tv_usec = 200000;

    /* Create the example messages */
    for (i = 0; i < NFRAMES; ++i)
    {
        struct can_frame * const frame = msg.frame + i;
        frame->can_id = MSGID + i;
        frame->can_dlc = MSGLEN;
        memset(frame->data, i, MSGLEN);
    }

    /* Register the cyclic messages. Note that all of the messages in the msg
     * struct will be sent with the same periodicity because they share the
     * same bcm_msg_head setup data.
     */
    if (write(s, &msg, sizeof(msg)) < 0)
    {
        perror(PROGNAME ": write: TX_SETUP");
        return errno;
    }

    printf("Cyclic messages registed with SocketCAN!\n"
           "Use a tool such as \"candump %s\" to view the messages.\n"
           "These messages will continue to transmit so long as the socket\n"
           "used to communicate with SocketCAN remains open. In other words,\n"
           "close this program with SIGINT or SIGTERM in order to gracefully\n"
           "stop transmitting.\n",
           iface);

    /* Spin forever here */
    while (0 == sigval) usleep(DELAY);

    puts("\nGoodbye!");

    /* Close the CAN interface */
    if (close(s) < 0)
    {
        perror(PROGNAME ": close");
        return errno;
    }

    return EXIT_SUCCESS;
}